

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack18_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 & 0x3ffff;
  out[1] = uVar1 >> 0x12;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x12 | (uVar2 & 0xf) << 0xe;
  out[2] = uVar2 >> 4 & 0x3ffff;
  out[3] = uVar2 >> 0x16;
  uVar1 = in[2];
  out[3] = uVar2 >> 0x16 | (uVar1 & 0xff) << 10;
  out[4] = uVar1 >> 8 & 0x3ffff;
  uVar2 = in[3];
  out[5] = uVar1 >> 0x1a;
  out[5] = uVar1 >> 0x1a | (uVar2 & 0xfff) << 6;
  out[6] = uVar2 >> 0xc & 0x3ffff;
  uVar1 = in[4];
  out[7] = uVar2 >> 0x1e;
  out[7] = (uVar1 & 0xffff) << 2 | uVar2 >> 0x1e;
  return in + 5;
}

Assistant:

const uint32_t *__fastunpack18_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 4)) << (18 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 18);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 8)) << (18 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 18);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 12)) << (18 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 18);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 16)) << (18 - 16);
  out++;

  return in + 1;
}